

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::InstanceArrayIntersectorKMB<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  size_t bits;
  ulong uVar11;
  undefined4 uVar12;
  NodeRef *pNVar13;
  size_t sVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  size_t sVar16;
  size_t sVar17;
  long lVar18;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar19;
  uint uVar20;
  Primitive_conflict4 *prim;
  bool bVar21;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar22;
  undefined1 auVar23 [64];
  vfloat_impl<4> __tmp;
  undefined1 auVar24 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar25;
  float fVar26;
  float fVar31;
  float fVar32;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar33;
  undefined1 auVar29 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar30;
  vint4 ai_2;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 ai_1;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_ZMM4 [64];
  vint4 ai_3;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 bi;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi_1;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 bi_3;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 ai;
  undefined1 auVar52 [16];
  vint4 bi_2;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  Precalculations pre;
  undefined1 local_1788 [16];
  vbool<4> valid_leaf;
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16e8;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  sVar16 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar16 != 8) {
    auVar53 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar29 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar53);
    iVar10 = vmovmskps_avx(auVar29);
    uVar11 = CONCAT44((int)((ulong)This->ptr >> 0x20),iVar10);
    if (iVar10 != 0) {
      auVar28 = *(undefined1 (*) [16])(ray + 0x40);
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar36 = vandps_avx(auVar28,auVar24);
      auVar34._8_4_ = 0x219392ef;
      auVar34._0_8_ = 0x219392ef219392ef;
      auVar34._12_4_ = 0x219392ef;
      auVar36 = vcmpps_avx(auVar36,auVar34,1);
      auVar37 = vblendvps_avx(auVar28,auVar34,auVar36);
      auVar36 = *(undefined1 (*) [16])(ray + 0x50);
      auVar49 = vandps_avx(auVar36,auVar24);
      auVar49 = vcmpps_avx(auVar49,auVar34,1);
      auVar38 = vblendvps_avx(auVar36,auVar34,auVar49);
      auVar49 = *(undefined1 (*) [16])(ray + 0x60);
      auVar24 = vandps_avx(auVar49,auVar24);
      auVar24 = vcmpps_avx(auVar24,auVar34,1);
      auVar24 = vblendvps_avx(auVar49,auVar34,auVar24);
      auVar34 = vrcpps_avx(auVar37);
      fVar2 = auVar34._0_4_;
      auVar27._0_4_ = auVar37._0_4_ * fVar2;
      fVar31 = auVar34._4_4_;
      auVar27._4_4_ = auVar37._4_4_ * fVar31;
      fVar4 = auVar34._8_4_;
      auVar27._8_4_ = auVar37._8_4_ * fVar4;
      fVar7 = auVar34._12_4_;
      auVar27._12_4_ = auVar37._12_4_ * fVar7;
      auVar54._8_4_ = 0x3f800000;
      auVar54._0_8_ = 0x3f8000003f800000;
      auVar54._12_4_ = 0x3f800000;
      auVar34 = vsubps_avx(auVar54,auVar27);
      auVar37 = vrcpps_avx(auVar38);
      fVar3 = auVar37._0_4_;
      auVar35._0_4_ = auVar38._0_4_ * fVar3;
      fVar32 = auVar37._4_4_;
      auVar35._4_4_ = auVar38._4_4_ * fVar32;
      fVar5 = auVar37._8_4_;
      auVar35._8_4_ = auVar38._8_4_ * fVar5;
      fVar8 = auVar37._12_4_;
      auVar35._12_4_ = auVar38._12_4_ * fVar8;
      auVar38 = vsubps_avx(auVar54,auVar35);
      auVar37 = vrcpps_avx(auVar24);
      fVar26 = auVar37._0_4_;
      auVar48._0_4_ = auVar24._0_4_ * fVar26;
      fVar33 = auVar37._4_4_;
      auVar48._4_4_ = auVar24._4_4_ * fVar33;
      fVar6 = auVar37._8_4_;
      auVar48._8_4_ = auVar24._8_4_ * fVar6;
      fVar9 = auVar37._12_4_;
      auVar48._12_4_ = auVar24._12_4_ * fVar9;
      auVar24 = vsubps_avx(auVar54,auVar48);
      auVar37 = ZEXT416(0) << 0x20;
      auVar28 = vcmpps_avx(auVar28,auVar37,1);
      auVar55._8_4_ = 1;
      auVar55._0_8_ = 0x100000001;
      auVar55._12_4_ = 1;
      auVar28 = vandps_avx(auVar55,auVar28);
      auVar36 = vcmpps_avx(auVar36,auVar37,1);
      auVar56._8_4_ = 2;
      auVar56._0_8_ = 0x200000002;
      auVar56._12_4_ = 2;
      auVar36 = vandps_avx(auVar56,auVar36);
      auVar36 = vorps_avx(auVar36,auVar28);
      auVar57 = ZEXT1664(*(undefined1 (*) [16])ray);
      auVar28 = vcmpps_avx(auVar49,auVar37,1);
      auVar49._8_4_ = 4;
      auVar49._0_8_ = 0x400000004;
      auVar49._12_4_ = 4;
      auVar28 = vandps_avx(auVar49,auVar28);
      auVar58 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
      auVar59 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
      auVar53 = vpor_avx(auVar29 ^ auVar53,auVar28);
      local_1758 = vpor_avx(auVar53,auVar36);
      do {
        lVar18 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
          }
        }
        uVar12 = *(undefined4 *)(local_1758 + lVar18 * 4);
        auVar53._4_4_ = uVar12;
        auVar53._0_4_ = uVar12;
        auVar53._8_4_ = uVar12;
        auVar53._12_4_ = uVar12;
        auVar53 = vpcmpeqd_avx(auVar53,local_1758);
        uVar12 = vmovmskps_avx(auVar53);
        uVar11 = uVar11 & ~CONCAT44((int)((ulong)lVar18 >> 0x20),uVar12);
      } while (uVar11 != 0);
      local_1758 = vpcmpeqd_avx(auVar53,auVar53);
      auVar29 = vpcmpeqd_avx(local_1758,(undefined1  [16])valid_i->field_0);
      auVar53 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),(undefined1  [16])0x0);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      local_16e8.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar53,auVar29);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar16;
      stack_near[1].field_0 = local_16e8;
      if (sVar16 != 0xfffffffffffffff8) {
        local_16f8 = fVar2 + auVar34._0_4_ * fVar2;
        fStack_16f4 = fVar31 + auVar34._4_4_ * fVar31;
        fStack_16f0 = fVar4 + auVar34._8_4_ * fVar4;
        fStack_16ec = fVar7 + auVar34._12_4_ * fVar7;
        local_1708 = fVar3 + auVar38._0_4_ * fVar3;
        fStack_1704 = fVar32 + auVar38._4_4_ * fVar32;
        fStack_1700 = fVar5 + auVar38._8_4_ * fVar5;
        fStack_16fc = fVar8 + auVar38._12_4_ * fVar8;
        local_1718 = fVar26 + auVar24._0_4_ * fVar26;
        fStack_1714 = fVar33 + auVar24._4_4_ * fVar33;
        fStack_1710 = fVar6 + auVar24._8_4_ * fVar6;
        fStack_170c = fVar9 + auVar24._12_4_ * fVar9;
        pNVar13 = stack_node + 1;
        auVar53 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),(undefined1  [16])0x0);
        auVar28._8_4_ = 0xff800000;
        auVar28._0_8_ = 0xff800000ff800000;
        auVar28._12_4_ = 0xff800000;
        local_1788 = vblendvps_avx(auVar28,auVar53,auVar29);
        paVar19 = &stack_near[2].field_0;
        local_1728 = *(undefined1 (*) [16])ray;
        local_1738 = *(undefined1 (*) [16])(ray + 0x10);
        local_1748 = *(undefined1 (*) [16])(ray + 0x20);
        do {
          paVar1 = paVar19 + -1;
          auVar23 = ZEXT1664((undefined1  [16])*paVar1);
          paVar19 = paVar19 + -1;
          auVar53 = vcmpps_avx((undefined1  [16])*paVar1,local_1788,1);
          if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar53[0xf] < '\0') {
            while( true ) {
              uVar20 = (uint)sVar16;
              if ((sVar16 & 8) != 0) break;
              uVar15 = sVar16 & 0xfffffffffffffff0;
              auVar53 = vcmpps_avx(local_1788,auVar23._0_16_,6);
              uVar11 = 0;
              auVar23 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              lVar18 = -0x10;
              sVar16 = 8;
              do {
                sVar17 = *(size_t *)(uVar15 + 0x20 + lVar18 * 2);
                if (sVar17 == 8) break;
                fVar2 = *(float *)(uVar15 + 0x90 + lVar18);
                fVar3 = *(float *)(uVar15 + 0x30 + lVar18);
                auVar29 = *(undefined1 (*) [16])(ray + 0x70);
                fVar26 = auVar29._0_4_;
                fVar31 = auVar29._4_4_;
                fVar32 = auVar29._8_4_;
                fVar33 = auVar29._12_4_;
                auVar36._0_4_ = fVar26 * fVar2 + fVar3;
                auVar36._4_4_ = fVar31 * fVar2 + fVar3;
                auVar36._8_4_ = fVar32 * fVar2 + fVar3;
                auVar36._12_4_ = fVar33 * fVar2 + fVar3;
                fVar2 = *(float *)(uVar15 + 0xb0 + lVar18);
                fVar3 = *(float *)(uVar15 + 0x50 + lVar18);
                auVar37._0_4_ = fVar26 * fVar2 + fVar3;
                auVar37._4_4_ = fVar31 * fVar2 + fVar3;
                auVar37._8_4_ = fVar32 * fVar2 + fVar3;
                auVar37._12_4_ = fVar33 * fVar2 + fVar3;
                fVar2 = *(float *)(uVar15 + 0xd0 + lVar18);
                fVar3 = *(float *)(uVar15 + 0x70 + lVar18);
                auVar40._0_4_ = fVar26 * fVar2 + fVar3;
                auVar40._4_4_ = fVar31 * fVar2 + fVar3;
                auVar40._8_4_ = fVar32 * fVar2 + fVar3;
                auVar40._12_4_ = fVar33 * fVar2 + fVar3;
                fVar2 = *(float *)(uVar15 + 0xa0 + lVar18);
                fVar3 = *(float *)(uVar15 + 0x40 + lVar18);
                auVar43._0_4_ = fVar26 * fVar2 + fVar3;
                auVar43._4_4_ = fVar31 * fVar2 + fVar3;
                auVar43._8_4_ = fVar32 * fVar2 + fVar3;
                auVar43._12_4_ = fVar33 * fVar2 + fVar3;
                fVar2 = *(float *)(uVar15 + 0xc0 + lVar18);
                fVar3 = *(float *)(uVar15 + 0x60 + lVar18);
                auVar46._0_4_ = fVar3 + fVar26 * fVar2;
                auVar46._4_4_ = fVar3 + fVar31 * fVar2;
                auVar46._8_4_ = fVar3 + fVar32 * fVar2;
                auVar46._12_4_ = fVar3 + fVar33 * fVar2;
                fVar2 = *(float *)(uVar15 + 0xe0 + lVar18);
                fVar3 = *(float *)(uVar15 + 0x80 + lVar18);
                auVar50._0_4_ = fVar2 * fVar26 + fVar3;
                auVar50._4_4_ = fVar2 * fVar31 + fVar3;
                auVar50._8_4_ = fVar2 * fVar32 + fVar3;
                auVar50._12_4_ = fVar2 * fVar33 + fVar3;
                auVar28 = vsubps_avx(auVar36,auVar57._0_16_);
                auVar52._0_4_ = local_16f8 * auVar28._0_4_;
                auVar52._4_4_ = fStack_16f4 * auVar28._4_4_;
                auVar52._8_4_ = fStack_16f0 * auVar28._8_4_;
                auVar52._12_4_ = fStack_16ec * auVar28._12_4_;
                auVar28 = vsubps_avx(auVar37,auVar58._0_16_);
                auVar38._0_4_ = local_1708 * auVar28._0_4_;
                auVar38._4_4_ = fStack_1704 * auVar28._4_4_;
                auVar38._8_4_ = fStack_1700 * auVar28._8_4_;
                auVar38._12_4_ = fStack_16fc * auVar28._12_4_;
                auVar28 = vsubps_avx(auVar40,auVar59._0_16_);
                auVar41._0_4_ = local_1718 * auVar28._0_4_;
                auVar41._4_4_ = fStack_1714 * auVar28._4_4_;
                auVar41._8_4_ = fStack_1710 * auVar28._8_4_;
                auVar41._12_4_ = fStack_170c * auVar28._12_4_;
                auVar28 = vsubps_avx(auVar43,auVar57._0_16_);
                auVar44._0_4_ = local_16f8 * auVar28._0_4_;
                auVar44._4_4_ = fStack_16f4 * auVar28._4_4_;
                auVar44._8_4_ = fStack_16f0 * auVar28._8_4_;
                auVar44._12_4_ = fStack_16ec * auVar28._12_4_;
                auVar28 = vsubps_avx(auVar46,auVar58._0_16_);
                auVar47._0_4_ = local_1708 * auVar28._0_4_;
                auVar47._4_4_ = fStack_1704 * auVar28._4_4_;
                auVar47._8_4_ = fStack_1700 * auVar28._8_4_;
                auVar47._12_4_ = fStack_16fc * auVar28._12_4_;
                auVar28 = vsubps_avx(auVar50,auVar59._0_16_);
                auVar51._0_4_ = local_1718 * auVar28._0_4_;
                auVar51._4_4_ = fStack_1714 * auVar28._4_4_;
                auVar51._8_4_ = fStack_1710 * auVar28._8_4_;
                auVar51._12_4_ = fStack_170c * auVar28._12_4_;
                auVar28 = vpminsd_avx(auVar52,auVar44);
                auVar36 = vpminsd_avx(auVar38,auVar47);
                auVar28 = vpmaxsd_avx(auVar28,auVar36);
                auVar36 = vpminsd_avx(auVar41,auVar51);
                auVar28 = vpmaxsd_avx(auVar28,auVar36);
                auVar36 = vpmaxsd_avx(auVar52,auVar44);
                auVar49 = vpmaxsd_avx(auVar38,auVar47);
                auVar49 = vpminsd_avx(auVar36,auVar49);
                auVar36 = vpmaxsd_avx(auVar41,auVar51);
                auVar36 = vpminsd_avx(auVar36,local_1788);
                auVar49 = vpminsd_avx(auVar49,auVar36);
                auVar36 = vpmaxsd_avx(auVar28,(undefined1  [16])local_16e8);
                if ((uVar20 & 7) == 6) {
                  auVar36 = vcmpps_avx(auVar36,auVar49,2);
                  uVar12 = *(undefined4 *)(uVar15 + 0xf0 + lVar18);
                  auVar42._4_4_ = uVar12;
                  auVar42._0_4_ = uVar12;
                  auVar42._8_4_ = uVar12;
                  auVar42._12_4_ = uVar12;
                  auVar49 = vcmpps_avx(auVar42,auVar29,2);
                  uVar12 = *(undefined4 *)(uVar15 + 0x100 + lVar18);
                  auVar45._4_4_ = uVar12;
                  auVar45._0_4_ = uVar12;
                  auVar45._8_4_ = uVar12;
                  auVar45._12_4_ = uVar12;
                  auVar29 = vcmpps_avx(auVar29,auVar45,1);
                  auVar29 = vandps_avx(auVar49,auVar29);
                  auVar29 = vandps_avx(auVar29,auVar36);
                }
                else {
                  auVar29 = vcmpps_avx(auVar36,auVar49,2);
                }
                auVar29 = vandps_avx(auVar29,auVar53);
                auVar29 = vpslld_avx(auVar29,0x1f);
                if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar29[0xf] < '\0') {
                  auVar39._8_4_ = 0x7f800000;
                  auVar39._0_8_ = 0x7f8000007f800000;
                  auVar39._12_4_ = 0x7f800000;
                  aVar30 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vblendvps_avx(auVar39,auVar28,auVar29);
                  aVar22 = auVar23._0_16_;
                  auVar29 = vcmpps_avx((undefined1  [16])aVar30,(undefined1  [16])aVar22,1);
                  sVar14 = sVar17;
                  aVar25 = aVar30;
                  if (((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                        (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       -1 < auVar29[0xf]) ||
                     (bVar21 = sVar16 != 8, sVar14 = sVar16, sVar16 = sVar17, aVar25 = aVar22,
                     aVar22 = aVar30, bVar21)) {
                    aVar30 = aVar22;
                    uVar11 = uVar11 + 1;
                    pNVar13->ptr = sVar14;
                    pNVar13 = pNVar13 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar19->v = aVar25;
                    paVar19 = paVar19 + 1;
                    sVar17 = sVar16;
                  }
                  auVar23 = ZEXT1664((undefined1  [16])aVar30);
                  sVar16 = sVar17;
                }
                lVar18 = lVar18 + 4;
              } while (lVar18 != 0);
              if (sVar16 == 8) goto LAB_00309516;
              if (1 < uVar11) {
                aVar30 = paVar19[-2];
                aVar25 = paVar19[-1];
                auVar53 = vcmpps_avx((undefined1  [16])aVar30,(undefined1  [16])aVar25,1);
                aVar22 = aVar25;
                if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar53[0xf] < '\0') {
                  paVar19[-2] = aVar25;
                  paVar19[-1] = aVar30;
                  auVar53 = vpermilps_avx(*(undefined1 (*) [16])(pNVar13 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar13 + -2) = auVar53;
                  aVar22 = aVar30;
                  aVar30 = aVar25;
                }
                if (uVar11 != 2) {
                  aVar25 = paVar19[-3];
                  auVar53 = vcmpps_avx((undefined1  [16])aVar25,(undefined1  [16])aVar22,1);
                  if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar53[0xf] < '\0') {
                    paVar19[-3] = aVar22;
                    paVar19[-1] = aVar25;
                    sVar17 = pNVar13[-3].ptr;
                    pNVar13[-3].ptr = pNVar13[-1].ptr;
                    pNVar13[-1].ptr = sVar17;
                    aVar25 = aVar22;
                  }
                  auVar53 = vcmpps_avx((undefined1  [16])aVar25,(undefined1  [16])aVar30,1);
                  if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar53[0xf] < '\0') {
                    paVar19[-3] = aVar30;
                    paVar19[-2] = aVar25;
                    auVar53 = vpermilps_avx(*(undefined1 (*) [16])(pNVar13 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar13 + -3) = auVar53;
                  }
                }
              }
            }
            if (sVar16 == 0xfffffffffffffff8) {
              return;
            }
            valid_leaf.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                 vcmpps_avx(local_1788,auVar23._0_16_,6);
            if (((((undefined1  [16])valid_leaf.field_0 >> 0x1f & (undefined1  [16])0x1) !=
                  (undefined1  [16])0x0 ||
                 ((undefined1  [16])valid_leaf.field_0 >> 0x3f & (undefined1  [16])0x1) !=
                 (undefined1  [16])0x0) ||
                ((undefined1  [16])valid_leaf.field_0 >> 0x5f & (undefined1  [16])0x1) !=
                (undefined1  [16])0x0) || valid_leaf.field_0._15_1_ < '\0') {
              lVar18 = (ulong)(uVar20 & 0xf) - 8;
              if (lVar18 != 0) {
                prim = (Primitive_conflict4 *)(sVar16 & 0xfffffffffffffff0);
                do {
                  InstanceArrayIntersectorKMB<4>::intersect(&valid_leaf,&pre,ray,context,prim);
                  prim = prim + 1;
                  lVar18 = lVar18 + -1;
                } while (lVar18 != 0);
                auVar57 = ZEXT1664(local_1728);
                auVar58 = ZEXT1664(local_1738);
                auVar59 = ZEXT1664(local_1748);
              }
              local_1788 = vblendvps_avx(local_1788,*(undefined1 (*) [16])(ray + 0x80),
                                         (undefined1  [16])valid_leaf.field_0);
            }
          }
LAB_00309516:
          sVar16 = pNVar13[-1].ptr;
          pNVar13 = pNVar13 + -1;
        } while (sVar16 != 0xfffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }